

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Parenthesizer::Parenthesizer
          (Parenthesizer *this,ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *w,Expr e,
          int prec)

{
  Buffer<char> *pBVar1;
  Precedence PVar2;
  size_t sVar3;
  
  this->writer_ = w;
  if (prec == -1) {
    prec = w->precedence_;
  }
  this->saved_precedence_ = w->precedence_;
  PVar2 = expr::PrecInfo::INFO[*(uint *)e.super_ExprBase.impl_];
  this->write_paren_ = (int)PVar2 < prec;
  if ((int)PVar2 < prec) {
    pBVar1 = w->writer_->buffer_;
    sVar3 = pBVar1->size_;
    if (sVar3 == pBVar1->capacity_) {
      (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
      sVar3 = pBVar1->size_;
    }
    pBVar1->size_ = sVar3 + 1;
    pBVar1->ptr_[sVar3] = '(';
    PVar2 = expr::PrecInfo::INFO[*(uint *)e.super_ExprBase.impl_];
  }
  w->precedence_ = PVar2;
  return;
}

Assistant:

ExprWriter<ExprTypes, VarNamer>::Parenthesizer::Parenthesizer(
    ExprWriter<ExprTypes, VarNamer> &w, Expr e, int prec)
: writer_(w), write_paren_(false) {
  saved_precedence_ = w.precedence_;
  if (prec == -1)
    prec = w.precedence_;
  write_paren_ = precedence(e) < prec;
  if (write_paren_)
    w.writer_ << '(';
  w.precedence_ = precedence(e);
}